

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::~vector(vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *this)

{
  memory_resource *pmVar1;
  
  clear(this);
  pmVar1 = (this->alloc).memoryResource;
  (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0x30,8);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }